

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_hex(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  error_flags eVar5;
  char *s_;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  basic_substring<const_char> bVar11;
  basic_substring<const_char> local_30;
  
  uVar6 = this->len;
  if (pos < uVar6) {
    s_ = this->str;
    bVar4 = false;
    uVar7 = pos;
    do {
      bVar1 = s_[uVar7];
      if (9 < (byte)(bVar1 - 0x30)) {
        uVar10 = bVar1 - 0x2e;
        if (uVar10 < 0x39) {
          if ((0x1f8000001f80000U >> ((ulong)uVar10 & 0x3f) & 1) != 0) goto LAB_00191baa;
          if ((ulong)uVar10 == 0) {
            uVar8 = uVar7 + 1;
            if (uVar6 <= uVar8) goto LAB_00191c24;
            s_ = this->str;
            bVar3 = false;
            uVar7 = uVar8;
            goto LAB_00191bef;
          }
        }
        if ((bVar1 & 0xdf) == 0x50) {
          bVar3 = false;
          goto LAB_00191c4c;
        }
        if ((((0x3b < bVar1) || ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
            ((bVar1 != 0x5d && (bVar1 != 0x7d)))) || (!bVar4)) goto LAB_00191bc2;
        basic_substring(&local_30,s_,uVar7);
        s_ = local_30.str;
        uVar6 = local_30.len;
        goto LAB_00191bc4;
      }
LAB_00191baa:
      uVar7 = uVar7 + 1;
      bVar4 = true;
    } while (uVar6 != uVar7);
    if (pos < uVar6) {
      s_ = this->str;
      goto LAB_00191bc4;
    }
  }
  s_ = this->str;
  goto LAB_00191bc2;
LAB_00191bef:
  do {
    bVar1 = s_[uVar7];
    if (9 < (byte)(bVar1 - 0x30)) {
      if ((0x25 < bVar1 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)) {
        if ((bVar1 & 0xdf) == 0x50) goto LAB_00191c4c;
        if (((((0x3b < bVar1) || ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
             (bVar1 != 0x5d)) && (bVar1 != 0x7d)) || (!bVar4 && !bVar3)) goto LAB_00191bc2;
        basic_substring(&local_30,s_,uVar7);
        s_ = local_30.str;
        uVar6 = local_30.len;
        goto LAB_00191bc4;
      }
    }
    uVar7 = uVar7 + 1;
    bVar3 = true;
  } while (uVar7 < uVar6);
LAB_00191c24:
  uVar7 = 0;
  if (uVar8 < uVar6) {
    uVar7 = uVar6;
  }
  s_ = this->str;
  if (!bVar4) {
    uVar6 = uVar7;
  }
  goto LAB_00191bc4;
LAB_00191c4c:
  if ((s_[uVar7] & 0xdfU) != 0x50) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      bVar11 = (basic_substring<const_char>)(*pcVar2)();
      return bVar11;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x195b,"str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
  }
  uVar8 = uVar7 + 2;
  if (((uVar8 < uVar6) && ((s_[uVar7 + 1] == '+' || (s_[uVar7 + 1] == '-')))) &&
     ((bool)(bVar4 | bVar3))) {
    bVar9 = s_[uVar8];
    bVar1 = bVar9 - 0x30;
    if (bVar1 < 10) {
      do {
        if ((3 - uVar6) + uVar8 == 2) goto LAB_00191bc4;
        bVar9 = s_[uVar8 + 1];
        uVar8 = uVar8 + 1;
      } while ((byte)(bVar9 - 0x30) < 10);
    }
    if ((bVar1 < 10) &&
       ((((bVar9 < 0x3c && ((0x800120100002601U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) ||
         (bVar9 == 0x5d)) || (bVar9 == 0x7d)))) {
      basic_substring(&local_30,s_,uVar8);
      s_ = local_30.str;
      uVar6 = local_30.len;
      goto LAB_00191bc4;
    }
  }
LAB_00191bc2:
  uVar6 = 0;
LAB_00191bc4:
  bVar11.len = uVar6;
  bVar11.str = s_;
  return bVar11;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_hex(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(_is_hex_char(c))
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_hex;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_hex;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_hex:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(_is_hex_char(c))
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_hex;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_hex:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }